

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64.h
# Opt level: O0

void fiat_25519_carry_mul(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  uint64_t x52;
  uint64_t x51;
  fiat_25519_uint1 x50;
  uint64_t x49;
  uint64_t x48;
  uint64_t x47;
  uint64_t x46;
  uint64_t x45;
  uint64_t x44;
  uint64_t x43;
  fiat_25519_uint128 x42;
  uint64_t x41;
  uint64_t x40;
  fiat_25519_uint128 x39;
  uint64_t x38;
  uint64_t x37;
  fiat_25519_uint128 x36;
  uint64_t x35;
  uint64_t x34;
  fiat_25519_uint128 x33;
  fiat_25519_uint128 x32;
  fiat_25519_uint128 x31;
  fiat_25519_uint128 x30;
  fiat_25519_uint128 x29;
  uint64_t x28;
  uint64_t x27;
  fiat_25519_uint128 x26;
  fiat_25519_uint128 x25;
  fiat_25519_uint128 x24;
  fiat_25519_uint128 x23;
  fiat_25519_uint128 x22;
  fiat_25519_uint128 x21;
  fiat_25519_uint128 x20;
  fiat_25519_uint128 x19;
  fiat_25519_uint128 x18;
  fiat_25519_uint128 x17;
  fiat_25519_uint128 x16;
  fiat_25519_uint128 x15;
  fiat_25519_uint128 x14;
  fiat_25519_uint128 x13;
  fiat_25519_uint128 x12;
  fiat_25519_uint128 x11;
  fiat_25519_uint128 x10;
  fiat_25519_uint128 x9;
  fiat_25519_uint128 x8;
  fiat_25519_uint128 x7;
  fiat_25519_uint128 x6;
  fiat_25519_uint128 x5;
  fiat_25519_uint128 x4;
  fiat_25519_uint128 x3;
  fiat_25519_uint128 x2;
  fiat_25519_uint128 x1;
  uint64_t *arg2_local;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = arg1[4];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = arg2[4] * 0x13;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = arg1[4];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = arg2[3] * 0x13;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = arg1[4];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = arg2[2] * 0x13;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = arg1[4];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = arg2[1] * 0x13;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = arg1[3];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = arg2[4] * 0x13;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = arg1[3];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = arg2[3] * 0x13;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = arg1[3];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = arg2[2] * 0x13;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = arg1[2];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = arg2[4] * 0x13;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = arg1[2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = arg2[3] * 0x13;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = arg1[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = arg2[4] * 0x13;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = arg1[4];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *arg2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = arg1[3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = arg2[1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = arg1[3];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *arg2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = arg1[2];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = arg2[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = arg1[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = arg2[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = arg1[2];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *arg2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = arg1[1];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = arg2[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = arg1[1];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = arg2[2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = arg1[1];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = arg2[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = arg1[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *arg2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *arg1;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = arg2[4];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *arg1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = arg2[3];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *arg1;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = arg2[2];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *arg1;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = arg2[1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *arg1;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *arg2;
  auVar4 = auVar25 * auVar50 +
           auVar10 * auVar35 + auVar9 * auVar34 + auVar7 * auVar32 + auVar4 * auVar29;
  uVar55 = auVar4._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar4._8_8_ << 0xd | uVar55 >> 0x33;
  auVar54 = auVar24 * auVar49 +
            auVar20 * auVar45 + auVar8 * auVar33 + auVar6 * auVar31 + auVar3 * auVar28 + auVar54;
  uVar56 = auVar54._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = auVar54._8_8_ * 0x2000 | uVar56 >> 0x33;
  auVar53 = auVar23 * auVar48 +
            auVar19 * auVar44 + auVar16 * auVar41 + auVar5 * auVar30 + auVar2 * auVar27 + auVar53;
  uVar57 = auVar53._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = auVar53._8_8_ * 0x2000 | uVar57 >> 0x33;
  auVar52 = auVar22 * auVar47 +
            auVar18 * auVar43 + auVar15 * auVar40 + auVar13 * auVar38 + auVar1 * auVar26 + auVar52;
  uVar58 = auVar52._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar52._8_8_ * 0x2000 | uVar58 >> 0x33;
  auVar51 = auVar21 * auVar46 +
            auVar17 * auVar42 + auVar14 * auVar39 + auVar12 * auVar37 + auVar11 * auVar36 + auVar51;
  uVar59 = auVar51._0_8_;
  uVar55 = (uVar55 & 0x7ffffffffffff) + (auVar51._8_8_ * 0x2000 | uVar59 >> 0x33) * 0x13;
  uVar56 = (uVar55 >> 0x33) + (uVar56 & 0x7ffffffffffff);
  *out1 = uVar55 & 0x7ffffffffffff;
  out1[1] = uVar56 & 0x7ffffffffffff;
  out1[2] = (uVar56 >> 0x33) + (uVar57 & 0x7ffffffffffff);
  out1[3] = uVar58 & 0x7ffffffffffff;
  out1[4] = uVar59 & 0x7ffffffffffff;
  return;
}

Assistant:

static FIAT_25519_FIAT_INLINE void fiat_25519_carry_mul(fiat_25519_tight_field_element out1, const fiat_25519_loose_field_element arg1, const fiat_25519_loose_field_element arg2) {
  fiat_25519_uint128 x1;
  fiat_25519_uint128 x2;
  fiat_25519_uint128 x3;
  fiat_25519_uint128 x4;
  fiat_25519_uint128 x5;
  fiat_25519_uint128 x6;
  fiat_25519_uint128 x7;
  fiat_25519_uint128 x8;
  fiat_25519_uint128 x9;
  fiat_25519_uint128 x10;
  fiat_25519_uint128 x11;
  fiat_25519_uint128 x12;
  fiat_25519_uint128 x13;
  fiat_25519_uint128 x14;
  fiat_25519_uint128 x15;
  fiat_25519_uint128 x16;
  fiat_25519_uint128 x17;
  fiat_25519_uint128 x18;
  fiat_25519_uint128 x19;
  fiat_25519_uint128 x20;
  fiat_25519_uint128 x21;
  fiat_25519_uint128 x22;
  fiat_25519_uint128 x23;
  fiat_25519_uint128 x24;
  fiat_25519_uint128 x25;
  fiat_25519_uint128 x26;
  uint64_t x27;
  uint64_t x28;
  fiat_25519_uint128 x29;
  fiat_25519_uint128 x30;
  fiat_25519_uint128 x31;
  fiat_25519_uint128 x32;
  fiat_25519_uint128 x33;
  uint64_t x34;
  uint64_t x35;
  fiat_25519_uint128 x36;
  uint64_t x37;
  uint64_t x38;
  fiat_25519_uint128 x39;
  uint64_t x40;
  uint64_t x41;
  fiat_25519_uint128 x42;
  uint64_t x43;
  uint64_t x44;
  uint64_t x45;
  uint64_t x46;
  uint64_t x47;
  uint64_t x48;
  uint64_t x49;
  fiat_25519_uint1 x50;
  uint64_t x51;
  uint64_t x52;
  x1 = ((fiat_25519_uint128)(arg1[4]) * ((arg2[4]) * UINT8_C(0x13)));
  x2 = ((fiat_25519_uint128)(arg1[4]) * ((arg2[3]) * UINT8_C(0x13)));
  x3 = ((fiat_25519_uint128)(arg1[4]) * ((arg2[2]) * UINT8_C(0x13)));
  x4 = ((fiat_25519_uint128)(arg1[4]) * ((arg2[1]) * UINT8_C(0x13)));
  x5 = ((fiat_25519_uint128)(arg1[3]) * ((arg2[4]) * UINT8_C(0x13)));
  x6 = ((fiat_25519_uint128)(arg1[3]) * ((arg2[3]) * UINT8_C(0x13)));
  x7 = ((fiat_25519_uint128)(arg1[3]) * ((arg2[2]) * UINT8_C(0x13)));
  x8 = ((fiat_25519_uint128)(arg1[2]) * ((arg2[4]) * UINT8_C(0x13)));
  x9 = ((fiat_25519_uint128)(arg1[2]) * ((arg2[3]) * UINT8_C(0x13)));
  x10 = ((fiat_25519_uint128)(arg1[1]) * ((arg2[4]) * UINT8_C(0x13)));
  x11 = ((fiat_25519_uint128)(arg1[4]) * (arg2[0]));
  x12 = ((fiat_25519_uint128)(arg1[3]) * (arg2[1]));
  x13 = ((fiat_25519_uint128)(arg1[3]) * (arg2[0]));
  x14 = ((fiat_25519_uint128)(arg1[2]) * (arg2[2]));
  x15 = ((fiat_25519_uint128)(arg1[2]) * (arg2[1]));
  x16 = ((fiat_25519_uint128)(arg1[2]) * (arg2[0]));
  x17 = ((fiat_25519_uint128)(arg1[1]) * (arg2[3]));
  x18 = ((fiat_25519_uint128)(arg1[1]) * (arg2[2]));
  x19 = ((fiat_25519_uint128)(arg1[1]) * (arg2[1]));
  x20 = ((fiat_25519_uint128)(arg1[1]) * (arg2[0]));
  x21 = ((fiat_25519_uint128)(arg1[0]) * (arg2[4]));
  x22 = ((fiat_25519_uint128)(arg1[0]) * (arg2[3]));
  x23 = ((fiat_25519_uint128)(arg1[0]) * (arg2[2]));
  x24 = ((fiat_25519_uint128)(arg1[0]) * (arg2[1]));
  x25 = ((fiat_25519_uint128)(arg1[0]) * (arg2[0]));
  x26 = (x25 + (x10 + (x9 + (x7 + x4))));
  x27 = (uint64_t)(x26 >> 51);
  x28 = (uint64_t)(x26 & UINT64_C(0x7ffffffffffff));
  x29 = (x21 + (x17 + (x14 + (x12 + x11))));
  x30 = (x22 + (x18 + (x15 + (x13 + x1))));
  x31 = (x23 + (x19 + (x16 + (x5 + x2))));
  x32 = (x24 + (x20 + (x8 + (x6 + x3))));
  x33 = (x27 + x32);
  x34 = (uint64_t)(x33 >> 51);
  x35 = (uint64_t)(x33 & UINT64_C(0x7ffffffffffff));
  x36 = (x34 + x31);
  x37 = (uint64_t)(x36 >> 51);
  x38 = (uint64_t)(x36 & UINT64_C(0x7ffffffffffff));
  x39 = (x37 + x30);
  x40 = (uint64_t)(x39 >> 51);
  x41 = (uint64_t)(x39 & UINT64_C(0x7ffffffffffff));
  x42 = (x40 + x29);
  x43 = (uint64_t)(x42 >> 51);
  x44 = (uint64_t)(x42 & UINT64_C(0x7ffffffffffff));
  x45 = (x43 * UINT8_C(0x13));
  x46 = (x28 + x45);
  x47 = (x46 >> 51);
  x48 = (x46 & UINT64_C(0x7ffffffffffff));
  x49 = (x47 + x35);
  x50 = (fiat_25519_uint1)(x49 >> 51);
  x51 = (x49 & UINT64_C(0x7ffffffffffff));
  x52 = (x50 + x38);
  out1[0] = x48;
  out1[1] = x51;
  out1[2] = x52;
  out1[3] = x41;
  out1[4] = x44;
}